

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LinkageUntangler.cc
# Opt level: O0

void __thiscall
LinkageUntangler::select_by_size(LinkageUntangler *this,uint64_t min_size,uint64_t max_size)

{
  size_type sVar1;
  reference pvVar2;
  ulong uVar3;
  ulong in_RDX;
  ulong in_RSI;
  undefined8 *in_RDI;
  int n;
  reference in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffe0;
  int iVar4;
  
  iVar4 = 1;
  do {
    uVar3 = (ulong)iVar4;
    sVar1 = std::vector<Node,_std::allocator<Node>_>::size
                      ((vector<Node,_std::allocator<Node>_> *)(*(long *)*in_RDI + 0x40));
    if (sVar1 <= uVar3) {
      return;
    }
    pvVar2 = std::vector<Node,_std::allocator<Node>_>::operator[]
                       ((vector<Node,_std::allocator<Node>_> *)(*(long *)*in_RDI + 0x40),(long)iVar4
                       );
    if (pvVar2->status != Deleted) {
      std::vector<Node,_std::allocator<Node>_>::operator[]
                ((vector<Node,_std::allocator<Node>_> *)(*(long *)*in_RDI + 0x40),(long)iVar4);
      uVar3 = std::__cxx11::string::size();
      if (in_RSI <= uVar3) {
        if (in_RDX != 0) {
          std::vector<Node,_std::allocator<Node>_>::operator[]
                    ((vector<Node,_std::allocator<Node>_> *)(*(long *)*in_RDI + 0x40),(long)iVar4);
          uVar3 = std::__cxx11::string::size();
          if (in_RDX < uVar3) goto LAB_0043d3fe;
        }
        in_stack_ffffffffffffffd0 =
             std::vector<bool,_std::allocator<bool>_>::operator[]
                       ((vector<bool,_std::allocator<bool>_> *)
                        CONCAT44(iVar4,in_stack_ffffffffffffffe0),in_stack_ffffffffffffffd0._M_mask)
        ;
        std::_Bit_reference::operator=((_Bit_reference *)&stack0xffffffffffffffd0,true);
      }
    }
LAB_0043d3fe:
    iVar4 = iVar4 + 1;
  } while( true );
}

Assistant:

void LinkageUntangler::select_by_size( uint64_t min_size, uint64_t max_size) {
    {
        for (auto n=1;n<dg.sdg.nodes.size();++n) {
            if (dg.sdg.nodes[n].status==NodeStatus::Deleted) continue;
            if (dg.sdg.nodes[n].sequence.size() >= min_size and
                (max_size==0 or dg.sdg.nodes[n].sequence.size() <= max_size))
                selected_nodes[n]=true;
        }
    }
}